

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressionMargin(void *src,size_t srcSize)

{
  unsigned_long_long uVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  ZSTD_frameSizeInfo frameSizeInfo;
  ZSTD_frameHeader zfh;
  ZSTD_frameSizeInfo local_78;
  ZSTD_frameHeader local_60;
  
  uVar5 = 0;
  if (srcSize == 0) {
    sVar4 = 0;
  }
  else {
    lVar3 = 0;
    do {
      ZSTD_findFrameSizeInfo(&local_78,src,srcSize);
      uVar1 = local_78.decompressedBound;
      sVar4 = local_78.compressedSize;
      sVar2 = ZSTD_getFrameHeader_advanced(&local_60,src,srcSize,ZSTD_f_zstd1);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      if (0xffffffffffffff88 < sVar4) {
        return 0xffffffffffffffec;
      }
      if (uVar1 == 0xfffffffffffffffe) {
        return 0xffffffffffffffec;
      }
      if (local_60.frameType == ZSTD_skippableFrame) {
        lVar3 = lVar3 + sVar4;
      }
      else {
        if (local_60.frameType != ZSTD_frame) {
          __assert_fail("zfh.frameType == ZSTD_skippableFrame",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x35a,"size_t ZSTD_decompressionMargin(const void *, size_t)");
        }
        lVar3 = local_78.nbBlocks * 3 +
                (ulong)(local_60.checksumFlag != 0) * 4 + lVar3 + (ulong)local_60.headerSize;
        if (uVar5 <= local_60.blockSizeMax) {
          uVar5 = local_60.blockSizeMax;
        }
      }
      if (srcSize < sVar4) {
        __assert_fail("srcSize >= compressedSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x35f,"size_t ZSTD_decompressionMargin(const void *, size_t)");
      }
      src = (void *)((long)src + sVar4);
      srcSize = srcSize - sVar4;
    } while (srcSize != 0);
    sVar4 = lVar3 + (ulong)uVar5;
  }
  return sVar4;
}

Assistant:

size_t ZSTD_decompressionMargin(void const* src, size_t srcSize)
{
    size_t margin = 0;
    unsigned maxBlockSize = 0;

    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        ZSTD_frameHeader zfh;

        FORWARD_IF_ERROR(ZSTD_getFrameHeader(&zfh, src, srcSize), "");
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ERROR(corruption_detected);

        if (zfh.frameType == ZSTD_frame) {
            /* Add the frame header to our margin */
            margin += zfh.headerSize;
            /* Add the checksum to our margin */
            margin += zfh.checksumFlag ? 4 : 0;
            /* Add 3 bytes per block */
            margin += 3 * frameSizeInfo.nbBlocks;

            /* Compute the max block size */
            maxBlockSize = MAX(maxBlockSize, zfh.blockSizeMax);
        } else {
            assert(zfh.frameType == ZSTD_skippableFrame);
            /* Add the entire skippable frame size to our margin. */
            margin += compressedSize;
        }

        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
    }

    /* Add the max block size back to the margin. */
    margin += maxBlockSize;

    return margin;
}